

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O0

void __thiscall
CCDPP::predict(CCDPP *this,vector<Rating,_std::allocator<Rating>_> *ratings,string *log)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pdVar4;
  ostream *this_00;
  void *this_01;
  string *in_RDX;
  vector<Rating,_std::allocator<Rating>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar5;
  value_type_conflict1 rmse;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  value_type_conflict1 result;
  int thread_index;
  vector<double,_std::allocator<double>_> rmses;
  int workload;
  int rating_size;
  task_type *in_stack_fffffffffffffec8;
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *in_stack_fffffffffffffed0;
  anon_class_40_5_3d67fc2e_for__M_f *in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  undefined1 *puVar6;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:145:45)_(int)>
  *in_stack_ffffffffffffff08;
  function0<void> *in_stack_ffffffffffffff10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e8;
  undefined1 *local_e0;
  double local_d8;
  int *local_d0;
  int *local_c8;
  vector<Rating,_std::allocator<Rating>_> *local_c0;
  undefined1 *local_b0;
  int local_58;
  undefined1 local_41;
  undefined8 local_40;
  undefined1 local_38 [24];
  int local_20;
  int local_1c [3];
  vector<Rating,_std::allocator<Rating>_> *local_10;
  
  local_10 = in_RSI;
  sVar3 = std::vector<Rating,_std::allocator<Rating>_>::size(in_RSI);
  local_1c[0] = (int)sVar3;
  iVar1 = *(int *)((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish + 0x24);
  local_20 = (local_1c[0] / iVar1 + 1) - (uint)(local_1c[0] % iVar1 == 0);
  local_40 = 0;
  puVar6 = &local_41;
  std::allocator<double>::allocator((allocator<double> *)0x19582a);
  std::vector<double,_std::allocator<double>_>::vector
            (in_RDI,(size_type)in_RDX,(value_type_conflict1 *)in_stack_fffffffffffffee0,
             (allocator_type *)in_stack_fffffffffffffed8);
  std::allocator<double>::~allocator((allocator<double> *)0x195858);
  for (local_58 = 0;
      local_58 <
      *(int *)((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 0x24); local_58 = local_58 + 1) {
    in_stack_fffffffffffffee0 =
         (vector<double,_std::allocator<double>_> *)
         in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_d0 = &local_20;
    local_c8 = local_1c;
    local_c0 = local_10;
    local_b0 = local_38;
    std::
    bind<CCDPP::predict(std::vector<Rating,std::allocator<Rating>>&,std::__cxx11::string)::_lambda(int)_1_,int&>
              (in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:145:45)_(int)>_>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(type)((ulong)puVar6 >> 0x20));
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    boost::function0<void>::~function0((function0<void> *)0x19591f);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          *)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish,(void *)0x0);
  local_d8 = 0.0;
  local_e0 = local_38;
  local_e8._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffed0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffec8);
    if (!bVar2) break;
    pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_e8);
    local_d8 = *pdVar4 + local_d8;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_e8);
  }
  this_00 = std::operator<<((ostream *)&std::cout,in_RDX);
  dVar5 = sqrt(local_d8 / (double)local_1c[0]);
  this_01 = (void *)std::ostream::operator<<(this_00,dVar5);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
  return;
}

Assistant:

inline void predict(vector<Rating> &ratings, const string log) {

        int rating_size = ratings.size();
        int workload = rating_size / parameter->num_of_thread + ((rating_size % parameter->num_of_thread == 0) ? 0 : 1);

        vector<value_type> rmses(parameter->num_of_thread, 0);

        for (int thread_index = 0; thread_index < parameter->num_of_thread; thread_index++) {
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(start + workload, rating_size);

                for (int i = start; i < end; i++) {
                    Rating &rating = ratings[i];
                    value_type prediction = 0;
                    for (int d = 0; d < parameter->k; d++) {
                        prediction += Q[d * user_num + rating.user_id] * P[d * item_num + rating.item_id];
                    }

                    value_type error = rating.score - prediction;
                    rmses[thread_index] += error * error;
                }
            }, thread_index));
        }
        thread_pool->wait();

        value_type result = 0;

        for (value_type rmse:rmses) {
            result += rmse;
        }

        cout << log << sqrt(result / rating_size) << endl;
    }